

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab1-2.c
# Opt level: O0

int FeederBig(void)

{
  DWORD DVar1;
  int iVar2;
  DWORD DVar3;
  uint uVar4;
  int local_2c;
  int i;
  DWORD t;
  char str [9];
  FILE *in;
  
  str._1_8_ = fopen("in.txt","w");
  if ((FILE *)str._1_8_ == (FILE *)0x0) {
    printf("can\'t create in.txt. No space on disk?\n");
  }
  else {
    printf("Creating large text... ");
    fflush(_stdout);
    stack0xffffffffffffffdf = 0x6463626164636261;
    str[0] = '\0';
    DVar1 = GetTickCount();
    iVar2 = fputs((char *)((long)&i + 3),(FILE *)str._1_8_);
    if ((iVar2 != -1) && (iVar2 = fputc(10,(FILE *)str._1_8_), iVar2 != -1)) {
      local_2c = 0;
      while( true ) {
        if (0x7fffff < local_2c) {
          fclose((FILE *)str._1_8_);
          DVar3 = GetTickCount();
          uVar4 = RoundUptoThousand(DVar3 - DVar1);
          printf("done in T=%u seconds. Starting exe with timeout 6*T... ",(ulong)uVar4 / 1000,
                 (ulong)uVar4 % 1000);
          LabTimeout = uVar4 * 6;
          fflush(_stdout);
          return 0;
        }
        iVar2 = fprintf((FILE *)str._1_8_,"%s",(long)&i + 3);
        if (iVar2 != 8) break;
        local_2c = local_2c + 1;
      }
      printf("can\'t write in in.txt. No space on disk?\n");
      return -1;
    }
    printf("can\'t write in in.txt. No space on disk?\n");
  }
  return -1;
}

Assistant:

static int FeederBig(void) {
    FILE *const in = fopen("in.txt", "w");
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    printf("Creating large text... ");
    fflush(stdout);
    const char str[] = "abcdabcd";
    DWORD t = GetTickCount();
    if (fputs(str, in) == EOF || fputc('\n', in) == EOF) {
        printf("can't write in in.txt. No space on disk?\n");
        return -1;
    }
    for (int i = 0; i < 1024 * 1024 * 8; ++i) {
        if (fprintf(in, "%s", str) != strlen(str)) {
            printf("can't write in in.txt. No space on disk?\n");
            return -1;
        }
    }
    fclose(in);
    t = RoundUptoThousand(GetTickCount() - t);
    printf("done in T=%u seconds. Starting exe with timeout 6*T... ", (unsigned)(t / 1000));
    LabTimeout = (int)t * 6;
    fflush(stdout);
    return 0;
}